

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::GetListOfMacros(cmMakefile *this,string *macros)

{
  string local_30;
  
  if (macros->_M_string_length == 0) {
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_30,&this->MacrosList,";");
    std::__cxx11::string::operator=((string *)macros,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("macros.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmMakefile.cxx"
                ,0xe9e,"void cmMakefile::GetListOfMacros(std::string &) const");
}

Assistant:

void cmMakefile::GetListOfMacros(std::string& macros) const
{
  assert(macros.empty());
  macros = cmJoin(this->MacrosList, ";");
}